

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_bitmapblit_quint16
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  quint32 *pqVar8;
  int x_1;
  ulong uVar9;
  int iVar10;
  uchar uVar11;
  ushort local_68;
  uchar *local_60;
  
  uVar9 = color->rgba;
  local_68 = (ushort)(uint)(uVar9 >> 0x2b) & 0x1f |
             (ushort)(uVar9 >> 0x15) & 0x7e0 | (ushort)uVar9 & 0xf800;
  local_60 = rasterBuffer->m_buffer + (long)x * 2 + (long)y * rasterBuffer->bytes_per_line;
  iVar5 = (int)((ulong)rasterBuffer->bytes_per_line >> 1);
  if (mapWidth < 9) {
    if (0 < mapHeight) {
      do {
        uVar11 = *map;
        if (uVar11 == '\0') {
          lVar4 = 0;
          iVar7 = 0;
        }
        else {
          iVar7 = 0;
          iVar6 = 0;
          do {
            if ((char)uVar11 < '\0') {
              iVar7 = iVar7 + 1;
            }
            else {
              if (iVar7 != 0) {
                pqVar8 = (quint32 *)(local_60 + (long)iVar6 * 2);
                uVar9 = (ulong)iVar7;
                if (((ulong)pqVar8 & 3) != 0) {
                  *(ushort *)pqVar8 = local_68;
                  pqVar8 = (quint32 *)((long)pqVar8 + 2);
                  uVar9 = uVar9 - 1;
                }
                if ((uVar9 & 1) != 0) {
                  *(ushort *)((long)pqVar8 + (uVar9 - 1) * 2) = local_68;
                }
                (*qt_memfill32)(pqVar8,CONCAT22(local_68,local_68),(long)uVar9 / 2);
                iVar6 = iVar6 + iVar7;
              }
              iVar6 = iVar6 + 1;
              iVar7 = 0;
            }
            uVar11 = uVar11 * '\x02';
          } while (uVar11 != '\0');
          lVar4 = (long)iVar6;
        }
        if (iVar7 != 0) {
          pqVar8 = (quint32 *)(local_60 + lVar4 * 2);
          uVar9 = (ulong)iVar7;
          if (((ulong)pqVar8 & 3) != 0) {
            *(ushort *)pqVar8 = local_68;
            pqVar8 = (quint32 *)((long)pqVar8 + 2);
            uVar9 = uVar9 - 1;
          }
          if ((uVar9 & 1) != 0) {
            *(ushort *)((long)pqVar8 + (uVar9 - 1) * 2) = local_68;
          }
          (*qt_memfill32)(pqVar8,CONCAT22(local_68,local_68),(long)uVar9 / 2);
        }
        local_60 = local_60 + (long)iVar5 * 2;
        map = map + mapStride;
        bVar1 = 1 < mapHeight;
        mapHeight = mapHeight + -1;
      } while (bVar1);
    }
  }
  else if (0 < mapHeight) {
    do {
      uVar9 = 0;
      iVar6 = 0;
      iVar7 = 0;
      do {
        uVar11 = map[uVar9 >> 3];
        iVar10 = -8;
        do {
          if ((char)uVar11 < '\0') {
            iVar6 = iVar6 + 1;
          }
          else {
            if (iVar6 == 0) {
              iVar2 = 1;
            }
            else {
              pqVar8 = (quint32 *)(local_60 + (long)iVar7 * 2);
              uVar3 = (ulong)iVar6;
              if (((ulong)pqVar8 & 3) != 0) {
                *(ushort *)pqVar8 = local_68;
                pqVar8 = (quint32 *)((long)pqVar8 + 2);
                uVar3 = uVar3 - 1;
              }
              if ((uVar3 & 1) != 0) {
                *(ushort *)((long)pqVar8 + (uVar3 - 1) * 2) = local_68;
              }
              (*qt_memfill32)(pqVar8,CONCAT22(local_68,local_68),(long)uVar3 / 2);
              iVar2 = iVar6 + 1;
            }
            if (uVar11 == '\0') {
              iVar7 = (iVar6 + iVar7) - iVar10;
              iVar6 = 0;
              break;
            }
            iVar7 = iVar7 + iVar2;
            iVar6 = 0;
          }
          uVar11 = uVar11 * '\x02';
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
        uVar9 = uVar9 + 8;
      } while ((int)uVar9 < mapWidth);
      if (iVar6 != 0) {
        pqVar8 = (quint32 *)(local_60 + (long)iVar7 * 2);
        uVar9 = (ulong)iVar6;
        if (((ulong)pqVar8 & 3) != 0) {
          *(ushort *)pqVar8 = local_68;
          pqVar8 = (quint32 *)((long)pqVar8 + 2);
          uVar9 = uVar9 - 1;
        }
        if ((uVar9 & 1) != 0) {
          *(ushort *)((long)pqVar8 + (uVar9 - 1) * 2) = local_68;
        }
        (*qt_memfill32)(pqVar8,CONCAT22(local_68,local_68),(long)uVar9 / 2);
      }
      local_60 = local_60 + (long)iVar5 * 2;
      map = map + mapStride;
      bVar1 = 1 < mapHeight;
      mapHeight = mapHeight + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

inline static void qt_bitmapblit_quint16(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    qt_bitmapblit_template<quint16>(rasterBuffer, x,  y, color.toRgb16(),
                                    map, mapWidth, mapHeight, mapStride);
}